

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Segment::CheckHeaderInfo(Segment *this)

{
  Track **ppTVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint32_t i;
  ulong uVar5;
  
  if (this->header_written_ != false) {
    return true;
  }
  bVar2 = WriteSegmentHeader(this);
  if (bVar2) {
    uVar3 = MaxOffset(this);
    bVar2 = SeekHead::AddSeekEntry(&this->seek_head_,0x1f43b675,uVar3);
    if (bVar2) {
      if (this->output_cues_ != true) {
        return true;
      }
      if (this->cues_track_ != 0) {
        return true;
      }
      uVar4 = (ulong)(this->tracks_).track_entries_size_;
      ppTVar1 = (this->tracks_).track_entries_;
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) goto LAB_001205a1;
        if (ppTVar1 == (Track **)0x0) {
          return false;
        }
        if (ppTVar1[uVar5] == (Track *)0x0) {
          return false;
        }
        uVar3 = ppTVar1[uVar5]->number_;
        bVar2 = Tracks::TrackIsVideo(&this->tracks_,uVar3);
        uVar5 = uVar5 + 1;
      } while (!bVar2);
      this->cues_track_ = uVar3;
      if (uVar3 != 0) {
        return true;
      }
LAB_001205a1:
      if ((uVar4 != 0 && ppTVar1 != (Track **)0x0) && (*ppTVar1 != (Track *)0x0)) {
        this->cues_track_ = (*ppTVar1)->number_;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Segment::CheckHeaderInfo() {
  if (!header_written_) {
    if (!WriteSegmentHeader())
      return false;

    if (!seek_head_.AddSeekEntry(libwebm::kMkvCluster, MaxOffset()))
      return false;

    if (output_cues_ && cues_track_ == 0) {
      // Check for a video track
      for (uint32_t i = 0; i < tracks_.track_entries_size(); ++i) {
        const Track* const track = tracks_.GetTrackByIndex(i);
        if (!track)
          return false;

        if (tracks_.TrackIsVideo(track->number())) {
          cues_track_ = track->number();
          break;
        }
      }

      // Set first track found
      if (cues_track_ == 0) {
        const Track* const track = tracks_.GetTrackByIndex(0);
        if (!track)
          return false;

        cues_track_ = track->number();
      }
    }
  }
  return true;
}